

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<TPZPostProcVar>::~TPZVec(TPZVec<TPZPostProcVar> *this)

{
  TPZPostProcVar *pTVar1;
  long lVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_017b4348;
  pTVar1 = this->fStore;
  if (pTVar1 != (TPZPostProcVar *)0x0) {
    lVar2 = pTVar1[-1].fNumEq;
    if (lVar2 != 0) {
      lVar3 = lVar2 * 0x38;
      do {
        TPZPostProcVar::~TPZPostProcVar
                  ((TPZPostProcVar *)((long)&pTVar1[-1].super_TPZSavable._vptr_TPZSavable + lVar3));
        lVar3 = lVar3 + -0x38;
      } while (lVar3 != 0);
    }
    operator_delete__(&pTVar1[-1].fNumEq,lVar2 * 0x38 + 8);
    return;
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}